

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

int htmlElementAllowedHere(htmlElemDesc *parent,xmlChar *elt)

{
  int iVar1;
  char **ppcVar2;
  
  iVar1 = 0;
  if ((parent != (htmlElemDesc *)0x0 && elt != (xmlChar *)0x0) &&
     (ppcVar2 = parent->subelts, ppcVar2 != (char **)0x0)) {
    do {
      if ((xmlChar *)*ppcVar2 == (xmlChar *)0x0) {
        return 0;
      }
      iVar1 = xmlStrcmp((xmlChar *)*ppcVar2,elt);
      ppcVar2 = ppcVar2 + 1;
    } while (iVar1 != 0);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int
htmlElementAllowedHere(const htmlElemDesc* parent, const xmlChar* elt) {
  const char** p ;

  if ( ! elt || ! parent || ! parent->subelts )
	return 0 ;

  for ( p = parent->subelts; *p; ++p )
    if ( !xmlStrcmp((const xmlChar *)*p, elt) )
      return 1 ;

  return 0 ;
}